

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# didxset.cpp
# Opt level: O0

void __thiscall soplex::DIdxSet::~DIdxSet(DIdxSet *this)

{
  DIdxSet *in_RDI;
  
  ~DIdxSet(in_RDI);
  operator_delete(in_RDI,0x20);
  return;
}

Assistant:

DIdxSet::~DIdxSet()
{
   if(idx)
      spx_free(idx);
}